

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O1

void __thiscall despot::RegDemo::RegDemo(RegDemo *this)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong uVar3;
  string map;
  istringstream iss;
  long *local_1f0;
  undefined8 local_1e8;
  long local_1e0;
  undefined8 uStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0 [13];
  ios_base local_138 [264];
  
  despot::DSPOMDP::DSPOMDP(&this->super_DSPOMDP);
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  *(undefined8 *)&this->field_0x38 = 0;
  *(undefined ***)this = &PTR__RegDemo_0010dad0;
  *(undefined ***)&this->super_MDP = &PTR__RegDemo_0010dbe0;
  *(undefined ***)&this->super_StateIndexer = &PTR__RegDemo_0010dc30;
  *(undefined ***)&this->super_StatePolicy = &PTR__RegDemo_0010dc68;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&this->trap_prob_,0,0x94);
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"mapSize = 7\n","");
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d0,"0 0 0 0.75 0.75 0.75 500\n","");
  uVar3 = 0xf;
  if (local_1b0 != local_1a0) {
    uVar3 = local_1a0[0];
  }
  if (uVar3 < (ulong)(local_1c8 + local_1a8)) {
    uVar3 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar3 = local_1c0[0];
    }
    if ((ulong)(local_1c8 + local_1a8) <= uVar3) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1b0);
      goto LAB_0010683b;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1d0);
LAB_0010683b:
  local_1f0 = &local_1e0;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_1e0 = *plVar1;
    uStack_1d8 = puVar2[3];
  }
  else {
    local_1e0 = *plVar1;
    local_1f0 = (long *)*puVar2;
  }
  local_1e8 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)&local_1b0,(string *)&local_1f0,_S_in)
  ;
  Init(this,(istream *)&local_1b0);
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  return;
}

Assistant:

RegDemo::RegDemo() {
	string map = string("mapSize = 7\n") + string("0 0 0 0.75 0.75 0.75 500\n");
	istringstream iss(map);
	Init(iss);
}